

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

int32_t getEBCDICPropertyNameChar(char *name)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 0x100;
  do {
    bVar1 = *name;
    uVar2 = (ulong)bVar1;
    if (uVar2 < 0x26) {
      if ((0x2000203820U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) {
          return iVar3;
        }
        goto LAB_00301687;
      }
    }
    else {
LAB_00301687:
      if ((0x2d < bVar1 - 0x40) || ((0x200100000001U >> ((ulong)(bVar1 - 0x40) & 0x3f) & 1) == 0)) {
        bVar1 = uprv_ebcdictolower_63(bVar1);
        return iVar3 + (uint)bVar1;
      }
    }
    name = (char *)((byte *)name + 1);
    iVar3 = iVar3 + 0x100;
  } while( true );
}

Assistant:

static inline int32_t
getEBCDICPropertyNameChar(const char *name) {
    int32_t i;
    char c;

    /* Ignore delimiters '-', '_', and EBCDIC White_Space */
    for(i=0;
        (c=name[i++])==0x60 || c==0x6d ||
        c==0x40 || c==0x05 || c==0x15 || c==0x25 || c==0x0b || c==0x0c || c==0x0d;
    ) {}

    if(c!=0) {
        return (i<<8)|(uint8_t)uprv_ebcdictolower((char)c);
    } else {
        return i<<8;
    }
}